

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

bool __thiscall cmCTestTestHandler::GenerateXML(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined1 local_8e0 [8];
  cmXMLWriter xml_1;
  undefined1 local_868 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_6f0 [8];
  cmGeneratedFileStream xmlfile_1;
  cmXMLWriter xml;
  string local_428 [32];
  undefined1 local_408 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_280 [8];
  cmGeneratedFileStream xmlfile;
  cmCTestTestHandler *this_local;
  
  xmlfile._608_8_ = this;
  bVar2 = cmCTest::GetProduceXML((this->super_cmCTestGenericHandler).CTest);
  if (bVar2) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_280,None);
    pcVar4 = "Test";
    if ((this->MemCheck & 1U) != 0) {
      pcVar4 = "DynamicAnalysis";
    }
    bVar2 = cmCTestGenericHandler::StartResultingXML
                      (&this->super_cmCTestGenericHandler,(this->MemCheck & 1) * 2 + PartTest,pcVar4
                       ,(cmGeneratedFileStream *)local_280);
    if (bVar2) {
      cmXMLWriter::cmXMLWriter((cmXMLWriter *)&xmlfile_1.field_0x260,(ostream *)local_280,0);
      (*(this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[9])();
      cmXMLWriter::~cmXMLWriter((cmXMLWriter *)&xmlfile_1.field_0x260);
      bVar2 = false;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
      poVar3 = std::operator<<((ostream *)local_408,"Cannot create ");
      pcVar4 = "testing";
      if ((this->MemCheck & 1U) != 0) {
        pcVar4 = "memory check";
      }
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3," XML file");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x2d7,pcVar4,false);
      std::__cxx11::string::~string(local_428);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
      this->LogFile = (ostream *)0x0;
      this_local._7_1_ = 0;
      bVar2 = true;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_280);
    if (bVar2) goto LAB_0030af6f;
  }
  if ((this->MemCheck & 1U) != 0) {
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_6f0,None);
    bVar2 = cmCTestGenericHandler::StartResultingXML
                      (&this->super_cmCTestGenericHandler,PartTest,"DynamicAnalysis-Test",
                       (cmGeneratedFileStream *)local_6f0);
    if (bVar2) {
      cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_8e0,(ostream *)local_6f0,0);
      GenerateCTestXML(this,(cmXMLWriter *)local_8e0);
      cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_8e0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_868);
      poVar3 = std::operator<<((ostream *)local_868,"Cannot create testing XML file");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x2e4,pcVar4,false);
      std::__cxx11::string::~string((string *)&xml_1.ElementOpen);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_868);
      this->LogFile = (ostream *)0x0;
      this_local._7_1_ = 0;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_6f0);
    if (!bVar2) goto LAB_0030af6f;
  }
  this_local._7_1_ = 1;
LAB_0030af6f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestTestHandler::GenerateXML()
{
  if (this->CTest->GetProduceXML()) {
    cmGeneratedFileStream xmlfile;
    if (!this->StartResultingXML(
          (this->MemCheck ? cmCTest::PartMemCheck : cmCTest::PartTest),
          (this->MemCheck ? "DynamicAnalysis" : "Test"), xmlfile)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot create "
                   << (this->MemCheck ? "memory check" : "testing")
                   << " XML file" << std::endl);
      this->LogFile = nullptr;
      return false;
    }
    cmXMLWriter xml(xmlfile);
    this->GenerateCTestXML(xml);
  }

  if (this->MemCheck) {
    cmGeneratedFileStream xmlfile;
    if (!this->StartResultingXML(cmCTest::PartTest, "DynamicAnalysis-Test",
                                 xmlfile)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot create testing XML file" << std::endl);
      this->LogFile = nullptr;
      return false;
    }
    cmXMLWriter xml(xmlfile);
    // Explicitly call this class' `GenerateCTestXML` method to make `Test.xml`
    // as well.
    this->cmCTestTestHandler::GenerateCTestXML(xml);
  }

  return true;
}